

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayer.cpp
# Opt level: O2

vector_type * __thiscall
nanoNet::NeuralNetworkLayer::predict
          (vector_type *__return_storage_ptr__,NeuralNetworkLayer *this,vector_type *inputData)

{
  size_t sVar1;
  size_t sVar2;
  pointer pvVar3;
  pointer pfVar4;
  pointer pfVar5;
  float *pfVar6;
  size_t sVar7;
  vector_type *__range1;
  size_t j;
  size_t sVar8;
  float *value;
  float *pfVar9;
  float fVar10;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,&this->m_biases);
  sVar1 = this->m_inputCount;
  sVar2 = this->m_outputCount;
  for (sVar7 = 0; sVar7 != sVar2; sVar7 = sVar7 + 1) {
    pvVar3 = (this->m_weights).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pfVar4 = (inputData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar5 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (sVar8 = 0; sVar1 != sVar8; sVar8 = sVar8 + 1) {
      pfVar5[sVar7] =
           *(float *)(*(long *)&pvVar3[sVar7].super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data + sVar8 * 4) * pfVar4[sVar8] +
           pfVar5[sVar7];
    }
  }
  pfVar6 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pfVar9 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start; pfVar9 != pfVar6; pfVar9 = pfVar9 + 1) {
    fVar10 = ActivationFunction::operator()(&this->m_activationFunction,*pfVar9);
    *pfVar9 = fVar10;
  }
  return __return_storage_ptr__;
}

Assistant:

NeuralNetworkLayer::vector_type NeuralNetworkLayer::predict(const vector_type& inputData) const
{
    vector_type result(m_biases);

    for (std::size_t i = 0; i < m_outputCount; i++)
        for (std::size_t j = 0; j < m_inputCount; j++)
            result[i] += m_weights[i][j] * inputData[j];

    for (auto& value : result)
        value = m_activationFunction(value);

    return result;
}